

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int luv_shutdown(lua_State *L)

{
  int iVar1;
  uv_stream_t *stream;
  uv_shutdown_t *req;
  luv_req_t *plVar2;
  int iVar3;
  
  iVar3 = 1;
  stream = luv_check_stream(L,1);
  iVar1 = luv_check_continuation(L,2);
  req = (uv_shutdown_t *)lua_newuserdata(L,0x50);
  plVar2 = luv_setup_req(L,iVar1);
  req->data = plVar2;
  iVar1 = uv_shutdown(req,stream,luv_shutdown_cb);
  if (iVar1 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int luv_shutdown(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_stream_t* handle = luv_check_stream(L, 1);
  int ref = luv_check_continuation(L, 2);
  uv_shutdown_t* req = (uv_shutdown_t*)lua_newuserdata(L, sizeof(*req));
  int ret;
  req->data = luv_setup_req(L, ctx, ref);
  ret = uv_shutdown(req, handle, luv_shutdown_cb);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  return 1;
}